

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O3

void universal_action(Architecture *conf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AddrSpace *ss;
  pointer ppRVar2;
  ActionGroup *pAVar3;
  Action *pAVar4;
  ActionExtraPopSetup *this;
  ActionGroup *pAVar5;
  ActionSegmentize *this_00;
  ActionDirectWrite *pAVar6;
  ActionRestructureVarnode *this_01;
  ActionInferTypes *this_02;
  ActionGroup *this_03;
  ActionPool *pAVar7;
  Rule *pRVar8;
  RulePtrFlow *this_04;
  RuleSubvarSext *this_05;
  ActionStackPtrFlow *this_06;
  ActionConstantPtr *this_07;
  pointer ppRVar9;
  string local_70;
  ActionGroup *local_50;
  ActionGroup *local_48;
  ActionGroup *local_40;
  AddrSpace *local_38;
  
  ss = (conf->super_AddrSpaceManager).stackspace;
  build_defaultactions(&conf->allacts);
  pAVar3 = (ActionGroup *)operator_new(0x90);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"universal","");
  ActionGroup::ActionGroup(pAVar3,8,&local_70);
  (pAVar3->super_Action)._vptr_Action = (_func_int **)&PTR__ActionGroup_003c2c30;
  *(undefined4 *)&pAVar3[1].super_Action._vptr_Action = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionDatabase::registerUniversal(&conf->allacts,(Action *)pAVar3);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionStart::ActionStart((ActionStart *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionConstbase::ActionConstbase((ActionConstbase *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"normalanalysis","");
  ActionNormalizeSetup::ActionNormalizeSetup((ActionNormalizeSetup *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionDefaultParams::ActionDefaultParams((ActionDefaultParams *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this = (ActionExtraPopSetup *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionExtraPopSetup::ActionExtraPopSetup(this,&local_70,ss);
  ActionGroup::addAction(pAVar3,(Action *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionPrototypeTypes::ActionPrototypeTypes((ActionPrototypeTypes *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionFuncLink::ActionFuncLink((ActionFuncLink *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"noproto","");
  ActionFuncLinkOutOnly::ActionFuncLinkOutOnly((ActionFuncLinkOutOnly *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar5 = (ActionGroup *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fullloop","");
  ActionGroup::ActionGroup(pAVar5,4,&local_70);
  local_48 = pAVar5;
  local_38 = ss;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar5 = (ActionGroup *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"mainloop","");
  ActionGroup::ActionGroup(pAVar5,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionVarnodeProps::ActionVarnodeProps((ActionVarnodeProps *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionHeritage::ActionHeritage((ActionHeritage *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionParamDouble::ActionParamDouble((ActionParamDouble *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_00 = (ActionSegmentize *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionSegmentize::ActionSegmentize(this_00,&local_70);
  ActionGroup::addAction(pAVar5,(Action *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"blockrecovery","");
  ActionForceGoto::ActionForceGoto((ActionForceGoto *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery_a","");
  ActionDirectWrite::ActionDirectWrite(pAVar6,&local_70,true);
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery_b","");
  ActionDirectWrite::ActionDirectWrite(pAVar6,&local_70,false);
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionActiveParam::ActionActiveParam((ActionActiveParam *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionReturnRecovery::ActionReturnRecovery((ActionReturnRecovery *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"localrecovery","");
  ActionRestrictLocal::ActionRestrictLocal((ActionRestrictLocal *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deadcode","");
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dynamic","");
  ActionDynamicMapping::ActionDynamicMapping((ActionDynamicMapping *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_01 = (ActionRestructureVarnode *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"localrecovery","");
  ActionRestructureVarnode::ActionRestructureVarnode(this_01,&local_70);
  ActionGroup::addAction(pAVar5,(Action *)this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionSpacebase::ActionSpacebase((ActionSpacebase *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  ActionNonzeroMask::ActionNonzeroMask((ActionNonzeroMask *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_02 = (ActionInferTypes *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  ActionInferTypes::ActionInferTypes(this_02,&local_70);
  ActionGroup::addAction(pAVar5,(Action *)this_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_03 = (ActionGroup *)operator_new(0x88);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_50 = this_03;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stackstall","");
  ActionGroup::ActionGroup(this_03,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar7 = (ActionPool *)operator_new(0x768);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"oppool1","");
  ActionPool::ActionPool(pAVar7,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_40 = pAVar3;
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deadcode","");
  RuleEarlyRemoval::RuleEarlyRemoval((RuleEarlyRemoval *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTermOrder::RuleTermOrder((RuleTermOrder *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSelectCse::RuleSelectCse((RuleSelectCse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleCollectTerms::RuleCollectTerms((RuleCollectTerms *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePullsubMulti::RulePullsubMulti((RulePullsubMulti *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePullsubIndirect::RulePullsubIndirect((RulePullsubIndirect *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nodejoin","");
  RulePushMulti::RulePushMulti((RulePushMulti *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSborrow::RuleSborrow((RuleSborrow *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleIntLessEqual::RuleIntLessEqual((RuleIntLessEqual *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTrivialArith::RuleTrivialArith((RuleTrivialArith *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTrivialBool::RuleTrivialBool((RuleTrivialBool *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTrivialShift::RuleTrivialShift((RuleTrivialShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSignShift::RuleSignShift((RuleSignShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTestSign::RuleTestSign((RuleTestSign *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleIdentityEl::RuleIdentityEl((RuleIdentityEl *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleOrMask::RuleOrMask((RuleOrMask *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndMask::RuleAndMask((RuleAndMask *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleOrConsume::RuleOrConsume((RuleOrConsume *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleOrCollapse::RuleOrCollapse((RuleOrCollapse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndOrLump::RuleAndOrLump((RuleAndOrLump *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShiftBitops::RuleShiftBitops((RuleShiftBitops *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleRightShiftAnd::RuleRightShiftAnd((RuleRightShiftAnd *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleNotDistribute::RuleNotDistribute((RuleNotDistribute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleHighOrderAnd::RuleHighOrderAnd((RuleHighOrderAnd *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndDistribute::RuleAndDistribute((RuleAndDistribute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndCommute::RuleAndCommute((RuleAndCommute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndPiece::RuleAndPiece((RuleAndPiece *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAndCompare::RuleAndCompare((RuleAndCompare *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDoubleSub::RuleDoubleSub((RuleDoubleSub *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDoubleShift::RuleDoubleShift((RuleDoubleShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDoubleArithShift::RuleDoubleArithShift((RuleDoubleArithShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleConcatShift::RuleConcatShift((RuleConcatShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLeftRight::RuleLeftRight((RuleLeftRight *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShiftCompare::RuleShiftCompare((RuleShiftCompare *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShift2Mult::RuleShift2Mult((RuleShift2Mult *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShiftPiece::RuleShiftPiece((RuleShiftPiece *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleMultiCollapse::RuleMultiCollapse((RuleMultiCollapse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleIndirectCollapse::RuleIndirectCollapse((RuleIndirectCollapse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  Rule2Comp2Mult::Rule2Comp2Mult((Rule2Comp2Mult *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSub2Add::RuleSub2Add((RuleSub2Add *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleCarryElim::RuleCarryElim((RuleCarryElim *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleBxor2NotEqual::RuleBxor2NotEqual((RuleBxor2NotEqual *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLess2Zero::RuleLess2Zero((RuleLess2Zero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLessEqual2Zero::RuleLessEqual2Zero((RuleLessEqual2Zero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSLess2Zero::RuleSLess2Zero((RuleSLess2Zero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleEqual2Zero::RuleEqual2Zero((RuleEqual2Zero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleEqual2Constant::RuleEqual2Constant((RuleEqual2Constant *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleThreeWayCompare::RuleThreeWayCompare((RuleThreeWayCompare *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleXorCollapse::RuleXorCollapse((RuleXorCollapse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleAddMultCollapse::RuleAddMultCollapse((RuleAddMultCollapse *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleCollapseConstants::RuleCollapseConstants((RuleCollapseConstants *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleTransformCpool::RuleTransformCpool((RuleTransformCpool *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePropagateCopy::RulePropagateCopy((RulePropagateCopy *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleZextEliminate::RuleZextEliminate((RuleZextEliminate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSlessToLess::RuleSlessToLess((RuleSlessToLess *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleZextSless::RuleZextSless((RuleZextSless *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleBitUndistribute::RuleBitUndistribute((RuleBitUndistribute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleBoolZext::RuleBoolZext((RuleBoolZext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleBooleanNegate::RuleBooleanNegate((RuleBooleanNegate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLogic2Bool::RuleLogic2Bool((RuleLogic2Bool *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSubExtComm::RuleSubExtComm((RuleSubExtComm *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSubCommute::RuleSubCommute((RuleSubCommute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleConcatCommute::RuleConcatCommute((RuleConcatCommute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleConcatZext::RuleConcatZext((RuleConcatZext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleZextCommute::RuleZextCommute((RuleZextCommute *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleZextShiftZext::RuleZextShiftZext((RuleZextShiftZext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShiftAnd::RuleShiftAnd((RuleShiftAnd *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleConcatZero::RuleConcatZero((RuleConcatZero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleConcatLeftShift::RuleConcatLeftShift((RuleConcatLeftShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleEmbed::RuleEmbed((RuleEmbed *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSubZext::RuleSubZext((RuleSubZext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSubCancel::RuleSubCancel((RuleSubCancel *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleShiftSub::RuleShiftSub((RuleShiftSub *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleHumptyDumpty::RuleHumptyDumpty((RuleHumptyDumpty *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDumptyHump::RuleDumptyHump((RuleDumptyHump *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleHumptyOr::RuleHumptyOr((RuleHumptyOr *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleNegateIdentity::RuleNegateIdentity((RuleNegateIdentity *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSubNormal::RuleSubNormal((RuleSubNormal *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePositiveDiv::RulePositiveDiv((RulePositiveDiv *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDivTermAdd::RuleDivTermAdd((RuleDivTermAdd *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDivTermAdd2::RuleDivTermAdd2((RuleDivTermAdd2 *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleDivOpt::RuleDivOpt((RuleDivOpt *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSignForm::RuleSignForm((RuleSignForm *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSignDiv2::RuleSignDiv2((RuleSignDiv2 *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSignNearMult::RuleSignNearMult((RuleSignNearMult *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleModOpt::RuleModOpt((RuleModOpt *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleSwitchSingle::RuleSwitchSingle((RuleSwitchSingle *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleCondNegate::RuleCondNegate((RuleCondNegate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleBoolNegate::RuleBoolNegate((RuleBoolNegate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLessEqual::RuleLessEqual((RuleLessEqual *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLessNotEqual::RuleLessNotEqual((RuleLessNotEqual *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleLessOne::RuleLessOne((RuleLessOne *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleRangeMeld::RuleRangeMeld((RuleRangeMeld *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleFloatRange::RuleFloatRange((RuleFloatRange *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePiece2Zext::RulePiece2Zext((RulePiece2Zext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RulePiece2Sext::RulePiece2Sext((RulePiece2Sext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarAnd::RuleSubvarAnd((RuleSubvarAnd *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarSubpiece::RuleSubvarSubpiece((RuleSubvarSubpiece *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSplitFlow::RuleSplitFlow((RuleSplitFlow *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_04 = (RulePtrFlow *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RulePtrFlow::RulePtrFlow(this_04,&local_70,conf);
  ActionPool::addRule(pAVar7,(Rule *)this_04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarCompZero::RuleSubvarCompZero((RuleSubvarCompZero *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarShift::RuleSubvarShift((RuleSubvarShift *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarZext::RuleSubvarZext((RuleSubvarZext *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_05 = (RuleSubvarSext *)operator_new(0x60);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"subvar","");
  RuleSubvarSext::RuleSubvarSext(this_05,&local_70);
  ActionPool::addRule(pAVar7,(Rule *)this_05);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleNegateNegate::RuleNegateNegate((RuleNegateNegate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"conditionalexe","");
  RuleConditionalMove::RuleConditionalMove((RuleConditionalMove *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"conditionalexe","");
  RuleOrPredicate::RuleOrPredicate((RuleOrPredicate *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  RuleFuncPtrEncoding::RuleFuncPtrEncoding((RuleFuncPtrEncoding *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"floatprecision","");
  RuleSubfloatConvert::RuleSubfloatConvert((RuleSubfloatConvert *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"floatprecision","");
  RuleFloatCast::RuleFloatCast((RuleFloatCast *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"floatprecision","");
  RuleIgnoreNan::RuleIgnoreNan((RuleIgnoreNan *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  RulePtraddUndo::RulePtraddUndo((RulePtraddUndo *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  RulePtrsubUndo::RulePtrsubUndo((RulePtrsubUndo *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"segment","");
  RuleSegment::RuleSegment((RuleSegment *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"doubleload","");
  RuleDoubleLoad::RuleDoubleLoad((RuleDoubleLoad *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"doubleprecis","");
  RuleDoubleIn::RuleDoubleIn((RuleDoubleIn *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar3 = local_50;
  ppRVar9 = (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar9 !=
      (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ActionPool::addRule(pAVar7,*ppRVar9);
      ppRVar9 = ppRVar9 + 1;
    } while (ppRVar9 !=
             (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppRVar2 = (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar9 != ppRVar2) {
      (conf->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppRVar2;
    }
  }
  ActionGroup::addAction(pAVar3,(Action *)pAVar7);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  ActionMultiCse::ActionMultiCse((ActionMultiCse *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  ActionShadowVar::ActionShadowVar((ActionShadowVar *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deindirect","");
  ActionDeindirect::ActionDeindirect((ActionDeindirect *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_06 = (ActionStackPtrFlow *)operator_new(0x78);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stackptrflow","");
  ActionStackPtrFlow::ActionStackPtrFlow(this_06,&local_70,local_38);
  ActionGroup::addAction(pAVar3,(Action *)this_06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionGroup::addAction(pAVar5,&pAVar3->super_Action);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deadcontrolflow","");
  ActionRedundBranch::ActionRedundBranch((ActionRedundBranch *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"blockrecovery","");
  ActionBlockStructure::ActionBlockStructure((ActionBlockStructure *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  this_07 = (ActionConstantPtr *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  ActionConstantPtr::ActionConstantPtr(this_07,&local_70);
  ActionGroup::addAction(pAVar5,(Action *)this_07);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar7 = (ActionPool *)operator_new(0x768);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"oppool2","");
  ActionPool::ActionPool(pAVar7,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  RulePushPtr::RulePushPtr((RulePushPtr *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  RuleStructOffset0::RuleStructOffset0((RuleStructOffset0 *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  RulePtrArith::RulePtrArith((RulePtrArith *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stackvars","");
  RuleLoadVarnode::RuleLoadVarnode((RuleLoadVarnode *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"stackvars","");
  RuleStoreVarnode::RuleStoreVarnode((RuleStoreVarnode *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionGroup::addAction(pAVar5,(Action *)pAVar7);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unreachable","");
  pAVar3 = local_40;
  ActionDeterminedBranch::ActionDeterminedBranch((ActionDeterminedBranch *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"unreachable","");
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nodejoin","");
  ActionNodeJoin::ActionNodeJoin((ActionNodeJoin *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"conditionalexe","");
  ActionConditionalExe::ActionConditionalExe((ActionConditionalExe *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"analysis","");
  ActionConditionalConst::ActionConditionalConst((ActionConditionalConst *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionGroup::addAction(local_48,(Action *)pAVar5);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionLikelyTrash::ActionLikelyTrash((ActionLikelyTrash *)pAVar4,&local_70);
  pAVar5 = local_48;
  ActionGroup::addAction(local_48,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery_a","");
  ActionDirectWrite::ActionDirectWrite(pAVar6,&local_70,true);
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery_b","");
  ActionDirectWrite::ActionDirectWrite(pAVar6,&local_70,false);
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deadcode","");
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"deadcontrolflow","");
  ActionDoNothing::ActionDoNothing((ActionDoNothing *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"switchnorm","");
  ActionSwitchNorm::ActionSwitchNorm((ActionSwitchNorm *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"returnsplit","");
  ActionReturnSplit::ActionReturnSplit((ActionReturnSplit *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionUnjustifiedParams::ActionUnjustifiedParams((ActionUnjustifiedParams *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"typerecovery","");
  ActionStartTypes::ActionStartTypes((ActionStartTypes *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionActiveReturn::ActionActiveReturn((ActionActiveReturn *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar5,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionGroup::addAction(pAVar3,&pAVar5->super_Action);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  ActionStartCleanUp::ActionStartCleanUp((ActionStartCleanUp *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar7 = (ActionPool *)operator_new(0x768);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  ActionPool::ActionPool(pAVar7,4,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  RuleMultNegOne::RuleMultNegOne((RuleMultNegOne *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  RuleAddUnsigned::RuleAddUnsigned((RuleAddUnsigned *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  Rule2Comp2Sub::Rule2Comp2Sub((Rule2Comp2Sub *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  RuleSubRight::RuleSubRight((RuleSubRight *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pRVar8 = (Rule *)operator_new(0x58);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cleanup","");
  RulePtrsubCharConstant::RulePtrsubCharConstant((RulePtrsubCharConstant *)pRVar8,&local_70);
  ActionPool::addRule(pAVar7,pRVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ActionGroup::addAction(pAVar3,(Action *)pAVar7);
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"blockrecovery","");
  ActionPreferComplement::ActionPreferComplement((ActionPreferComplement *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"normalizebranches","");
  ActionNormalizeBranches::ActionNormalizeBranches((ActionNormalizeBranches *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionAssignHigh::ActionAssignHigh((ActionAssignHigh *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMergeRequired::ActionMergeRequired((ActionMergeRequired *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMarkExplicit::ActionMarkExplicit((ActionMarkExplicit *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMarkImplied::ActionMarkImplied((ActionMarkImplied *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMergeCopy::ActionMergeCopy((ActionMergeCopy *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionDominantCopy::ActionDominantCopy((ActionDominantCopy *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMarkIndirectOnly::ActionMarkIndirectOnly((ActionMarkIndirectOnly *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMergeAdjacent::ActionMergeAdjacent((ActionMergeAdjacent *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionMergeType::ActionMergeType((ActionMergeType *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionHideShadow::ActionHideShadow((ActionHideShadow *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionCopyMarker::ActionCopyMarker((ActionCopyMarker *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"localrecovery","");
  ActionOutputPrototype::ActionOutputPrototype((ActionOutputPrototype *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fixateproto","");
  ActionInputPrototype::ActionInputPrototype((ActionInputPrototype *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"localrecovery","");
  ActionRestructureHigh::ActionRestructureHigh((ActionRestructureHigh *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"fixateglobals","");
  ActionMapGlobals::ActionMapGlobals((ActionMapGlobals *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dynamic","");
  ActionDynamicSymbols::ActionDynamicSymbols((ActionDynamicSymbols *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"merge","");
  ActionNameVars::ActionNameVars((ActionNameVars *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"casts","");
  ActionSetCasts::ActionSetCasts((ActionSetCasts *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"blockrecovery","");
  ActionFinalStructure::ActionFinalStructure((ActionFinalStructure *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"protorecovery","");
  ActionPrototypeWarnings::ActionPrototypeWarnings((ActionPrototypeWarnings *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pAVar4 = (Action *)operator_new(0x68);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"base","");
  ActionStop::ActionStop((ActionStop *)pAVar4,&local_70);
  ActionGroup::addAction(pAVar3,pAVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void universal_action(Architecture *conf)

{
  vector<Rule *>::iterator iter;
  ActionGroup *act;
  ActionGroup *actmainloop;
  ActionGroup *actfullloop;
  ActionPool *actprop,*actprop2;
  ActionPool *actcleanup;
  ActionGroup *actstackstall;
  AddrSpace *stackspace = conf->getStackSpace();

  build_defaultactions(conf->allacts);
  act = new ActionRestartGroup(Action::rule_onceperfunc,"universal",1);
  conf->allacts.registerUniversal(act);

  act->addAction( new ActionStart("base"));
  act->addAction( new ActionConstbase("base"));
  act->addAction( new ActionNormalizeSetup("normalanalysis"));
  act->addAction( new ActionDefaultParams("base"));
  //  act->addAction( new ActionParamShiftStart("paramshift") );
  act->addAction( new ActionExtraPopSetup("base",stackspace) );
  act->addAction( new ActionPrototypeTypes("protorecovery"));
  act->addAction( new ActionFuncLink("protorecovery") );
  act->addAction( new ActionFuncLinkOutOnly("noproto") );
  {
    actfullloop = new ActionGroup(Action::rule_repeatapply,"fullloop");
    {
      actmainloop = new ActionGroup(Action::rule_repeatapply,"mainloop");
      actmainloop->addAction( new ActionUnreachable("base") );
      actmainloop->addAction( new ActionVarnodeProps("base") );
      actmainloop->addAction( new ActionHeritage("base") );
      actmainloop->addAction( new ActionParamDouble("protorecovery") );
      actmainloop->addAction( new ActionSegmentize("base"));
      actmainloop->addAction( new ActionForceGoto("blockrecovery") );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
      actmainloop->addAction( new ActionActiveParam("protorecovery") );
      actmainloop->addAction( new ActionReturnRecovery("protorecovery") );
      //      actmainloop->addAction( new ActionParamShiftStop("paramshift") );
      actmainloop->addAction( new ActionRestrictLocal("localrecovery") ); // Do before dead code removed
      actmainloop->addAction( new ActionDeadCode("deadcode") );
      actmainloop->addAction( new ActionDynamicMapping("dynamic") ); // Must come before restructurevarnode and infertypes
      actmainloop->addAction( new ActionRestructureVarnode("localrecovery") );
      actmainloop->addAction( new ActionSpacebase("base") );	// Must come before infertypes and nonzeromask
      actmainloop->addAction( new ActionNonzeroMask("analysis") );
      actmainloop->addAction( new ActionInferTypes("typerecovery") );
      actstackstall = new ActionGroup(Action::rule_repeatapply,"stackstall");
      {
	actprop = new ActionPool(Action::rule_repeatapply,"oppool1");
	actprop->addRule( new RuleEarlyRemoval("deadcode"));
	actprop->addRule( new RuleTermOrder("analysis"));
	actprop->addRule( new RuleSelectCse("analysis"));
	actprop->addRule( new RuleCollectTerms("analysis"));
	actprop->addRule( new RulePullsubMulti("analysis"));
	actprop->addRule( new RulePullsubIndirect("analysis"));
	actprop->addRule( new RulePushMulti("nodejoin"));
	actprop->addRule( new RuleSborrow("analysis") );
	actprop->addRule( new RuleIntLessEqual("analysis") );
	actprop->addRule( new RuleTrivialArith("analysis") );
	actprop->addRule( new RuleTrivialBool("analysis") );
	actprop->addRule( new RuleTrivialShift("analysis") );
	actprop->addRule( new RuleSignShift("analysis") );
	actprop->addRule( new RuleTestSign("analysis") );
	actprop->addRule( new RuleIdentityEl("analysis") );
	actprop->addRule( new RuleOrMask("analysis") );
	actprop->addRule( new RuleAndMask("analysis") );
	actprop->addRule( new RuleOrConsume("analysis") );
	actprop->addRule( new RuleOrCollapse("analysis") );
	actprop->addRule( new RuleAndOrLump("analysis") );
	actprop->addRule( new RuleShiftBitops("analysis") );
	actprop->addRule( new RuleRightShiftAnd("analysis") );
	actprop->addRule( new RuleNotDistribute("analysis") );
	actprop->addRule( new RuleHighOrderAnd("analysis") );
	actprop->addRule( new RuleAndDistribute("analysis") );
	actprop->addRule( new RuleAndCommute("analysis") );
	actprop->addRule( new RuleAndPiece("analysis") );
	actprop->addRule( new RuleAndCompare("analysis") );
	actprop->addRule( new RuleDoubleSub("analysis") );
	actprop->addRule( new RuleDoubleShift("analysis") );
	actprop->addRule( new RuleDoubleArithShift("analysis") );
	actprop->addRule( new RuleConcatShift("analysis") );
	actprop->addRule( new RuleLeftRight("analysis") );
	actprop->addRule( new RuleShiftCompare("analysis") );
	actprop->addRule( new RuleShift2Mult("analysis") );
	actprop->addRule( new RuleShiftPiece("analysis") );
	actprop->addRule( new RuleMultiCollapse("analysis") );
	actprop->addRule( new RuleIndirectCollapse("analysis") );
	actprop->addRule( new Rule2Comp2Mult("analysis") );
	actprop->addRule( new RuleSub2Add("analysis") );
	actprop->addRule( new RuleCarryElim("analysis") );
	actprop->addRule( new RuleBxor2NotEqual("analysis") );
	actprop->addRule( new RuleLess2Zero("analysis") );
	actprop->addRule( new RuleLessEqual2Zero("analysis") );
	actprop->addRule( new RuleSLess2Zero("analysis") );
	actprop->addRule( new RuleEqual2Zero("analysis") );
	actprop->addRule( new RuleEqual2Constant("analysis") );
	actprop->addRule( new RuleThreeWayCompare("analysis") );
	actprop->addRule( new RuleXorCollapse("analysis") );
	actprop->addRule( new RuleAddMultCollapse("analysis") );
	actprop->addRule( new RuleCollapseConstants("analysis") );
	actprop->addRule( new RuleTransformCpool("analysis") );
	actprop->addRule( new RulePropagateCopy("analysis") );
	actprop->addRule( new RuleZextEliminate("analysis") );
	actprop->addRule( new RuleSlessToLess("analysis") );
	actprop->addRule( new RuleZextSless("analysis") );
	actprop->addRule( new RuleBitUndistribute("analysis") );
	actprop->addRule( new RuleBoolZext("analysis") );
	actprop->addRule( new RuleBooleanNegate("analysis") );
	actprop->addRule( new RuleLogic2Bool("analysis") );
	actprop->addRule( new RuleSubExtComm("analysis") );
	actprop->addRule( new RuleSubCommute("analysis") );
	actprop->addRule( new RuleConcatCommute("analysis") );
	actprop->addRule( new RuleConcatZext("analysis") );
	actprop->addRule( new RuleZextCommute("analysis") );
	actprop->addRule( new RuleZextShiftZext("analysis") );
	actprop->addRule( new RuleShiftAnd("analysis") );
	actprop->addRule( new RuleConcatZero("analysis") );
	actprop->addRule( new RuleConcatLeftShift("analysis") );
	actprop->addRule( new RuleEmbed("analysis") );
	actprop->addRule( new RuleSubZext("analysis") );
	actprop->addRule( new RuleSubCancel("analysis") );
	actprop->addRule( new RuleShiftSub("analysis") );
	actprop->addRule( new RuleHumptyDumpty("analysis") );
	actprop->addRule( new RuleDumptyHump("analysis") );
	actprop->addRule( new RuleHumptyOr("analysis") );
	actprop->addRule( new RuleNegateIdentity("analysis") );
	actprop->addRule( new RuleSubNormal("analysis") );
	actprop->addRule( new RulePositiveDiv("analysis") );
	actprop->addRule( new RuleDivTermAdd("analysis") );
	actprop->addRule( new RuleDivTermAdd2("analysis") );
	actprop->addRule( new RuleDivOpt("analysis") );
	actprop->addRule( new RuleSignForm("analysis") );
	actprop->addRule( new RuleSignDiv2("analysis") );
	actprop->addRule( new RuleSignNearMult("analysis") );
	actprop->addRule( new RuleModOpt("analysis") );
	actprop->addRule( new RuleSwitchSingle("analysis") );
	actprop->addRule( new RuleCondNegate("analysis") );
	actprop->addRule( new RuleBoolNegate("analysis") );
	actprop->addRule( new RuleLessEqual("analysis") );
	actprop->addRule( new RuleLessNotEqual("analysis") );
	actprop->addRule( new RuleLessOne("analysis") );
	actprop->addRule( new RuleRangeMeld("analysis") );
	actprop->addRule( new RuleFloatRange("analysis") );
	actprop->addRule( new RulePiece2Zext("analysis") );
	actprop->addRule( new RulePiece2Sext("analysis") );
	actprop->addRule( new RuleSubvarAnd("subvar") );
	actprop->addRule( new RuleSubvarSubpiece("subvar") );
	actprop->addRule( new RuleSplitFlow("subvar") );
	actprop->addRule( new RulePtrFlow("subvar",conf) );
	actprop->addRule( new RuleSubvarCompZero("subvar") );
	actprop->addRule( new RuleSubvarShift("subvar") );
	actprop->addRule( new RuleSubvarZext("subvar") );
	actprop->addRule( new RuleSubvarSext("subvar") );
	actprop->addRule( new RuleNegateNegate("analysis") );
	actprop->addRule( new RuleConditionalMove("conditionalexe") );
	actprop->addRule( new RuleOrPredicate("conditionalexe") );
	actprop->addRule( new RuleFuncPtrEncoding("analysis") );
	actprop->addRule( new RuleSubfloatConvert("floatprecision") );
	actprop->addRule( new RuleFloatCast("floatprecision") );
	actprop->addRule( new RuleIgnoreNan("floatprecision") );
	actprop->addRule( new RulePtraddUndo("typerecovery") );
	actprop->addRule( new RulePtrsubUndo("typerecovery") );
	actprop->addRule( new RuleSegment("segment") );

	actprop->addRule( new RuleDoubleLoad("doubleload") );
	actprop->addRule( new RuleDoubleIn("doubleprecis") );
	for(iter=conf->extra_pool_rules.begin();iter!=conf->extra_pool_rules.end();++iter)
	  actprop->addRule( *iter ); // Add CPU specific rules
	conf->extra_pool_rules.clear(); // Rules are now absorbed into universal
      }
      actstackstall->addAction( actprop );
      actstackstall->addAction( new ActionMultiCse("analysis") );
      actstackstall->addAction( new ActionShadowVar("analysis") );
      actstackstall->addAction( new ActionDeindirect("deindirect") );
      actstackstall->addAction( new ActionStackPtrFlow("stackptrflow",stackspace));
      actmainloop->addAction( actstackstall );
      actmainloop->addAction( new ActionRedundBranch("deadcontrolflow") ); // dead code removal
      actmainloop->addAction( new ActionBlockStructure("blockrecovery"));
      actmainloop->addAction( new ActionConstantPtr("typerecovery") );
      {
	actprop2 = new ActionPool(Action::rule_repeatapply,"oppool2");

	actprop2->addRule( new RulePushPtr("typerecovery") );
	actprop2->addRule( new RuleStructOffset0("typerecovery") );
	actprop2->addRule( new RulePtrArith("typerecovery") );
	//	actprop2->addRule( new RuleIndirectConcat("analysis") );
	actprop2->addRule( new RuleLoadVarnode("stackvars") );
	actprop2->addRule( new RuleStoreVarnode("stackvars") );
      }
      actmainloop->addAction( actprop2 );
      actmainloop->addAction( new ActionDeterminedBranch("unreachable") );
      actmainloop->addAction( new ActionUnreachable("unreachable") );
      actmainloop->addAction( new ActionNodeJoin("nodejoin") );
      actmainloop->addAction( new ActionConditionalExe("conditionalexe") );
      actmainloop->addAction( new ActionConditionalConst("analysis") );
    }
    actfullloop->addAction( actmainloop );
    actfullloop->addAction( new ActionLikelyTrash("protorecovery") );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
    actfullloop->addAction( new ActionDeadCode("deadcode") );
    actfullloop->addAction( new ActionDoNothing("deadcontrolflow") );
    actfullloop->addAction( new ActionSwitchNorm("switchnorm") );
    actfullloop->addAction( new ActionReturnSplit("returnsplit") );
    actfullloop->addAction( new ActionUnjustifiedParams("protorecovery") );
    actfullloop->addAction( new ActionStartTypes("typerecovery") );
    actfullloop->addAction( new ActionActiveReturn("protorecovery") );
  }
  act->addAction( actfullloop );
  act->addAction( new ActionStartCleanUp("cleanup") );
  {
    actcleanup = new ActionPool(Action::rule_repeatapply,"cleanup");

    actcleanup->addRule( new RuleMultNegOne("cleanup") );
    actcleanup->addRule( new RuleAddUnsigned("cleanup") );
    actcleanup->addRule( new Rule2Comp2Sub("cleanup") );
    actcleanup->addRule( new RuleSubRight("cleanup") );
    actcleanup->addRule( new RulePtrsubCharConstant("cleanup") );
  }
  act->addAction( actcleanup );

  act->addAction( new ActionPreferComplement("blockrecovery") );
  act->addAction( new ActionNormalizeBranches("normalizebranches") );
  act->addAction( new ActionAssignHigh("merge") );
  act->addAction( new ActionMergeRequired("merge") );
  act->addAction( new ActionMarkExplicit("merge") );
  act->addAction( new ActionMarkImplied("merge") ); // This must come BEFORE general merging
  act->addAction( new ActionMergeCopy("merge") );
  act->addAction( new ActionDominantCopy("merge") );
  act->addAction( new ActionMarkIndirectOnly("merge") ); // Must come after required merges but before speculative
  act->addAction( new ActionMergeAdjacent("merge") );
  act->addAction( new ActionMergeType("merge") );
  act->addAction( new ActionHideShadow("merge") );
  act->addAction( new ActionCopyMarker("merge") );
  act->addAction( new ActionOutputPrototype("localrecovery") );
  act->addAction( new ActionInputPrototype("fixateproto") );
  act->addAction( new ActionRestructureHigh("localrecovery") );
  act->addAction( new ActionMapGlobals("fixateglobals") );
  act->addAction( new ActionDynamicSymbols("dynamic") );
  act->addAction( new ActionNameVars("merge") );
  act->addAction( new ActionSetCasts("casts") );
  act->addAction( new ActionFinalStructure("blockrecovery") );
  act->addAction( new ActionPrototypeWarnings("protorecovery") );
  act->addAction( new ActionStop("base") );
}